

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_type_array(CompilerReflection *this,SPIRType *type)

{
  Stream *pSVar1;
  uint *puVar2;
  size_t sVar3;
  bool *pbVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  allocator local_49;
  string local_48;
  
  bVar5 = Compiler::is_physical_pointer((Compiler *)this,type);
  if ((!bVar5) && ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_48,"array",&local_49);
    simple_json::Stream::emit_json_key_array(pSVar1,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    puVar2 = (type->array).super_VectorView<unsigned_int>.ptr;
    sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    for (lVar7 = 0;
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        sVar3 << 2 != lVar7; lVar7 = lVar7 + 4) {
      simple_json::Stream::emit_json_array_value(pSVar1,*(uint32_t *)((long)puVar2 + lVar7));
    }
    simple_json::Stream::end_json_array(pSVar1);
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_48,"array_size_is_literal",&local_49);
    simple_json::Stream::emit_json_key_array(pSVar1,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    pbVar4 = (type->array_size_literal).super_VectorView<bool>.ptr;
    sVar3 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    for (sVar6 = 0;
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        sVar3 != sVar6; sVar6 = sVar6 + 1) {
      simple_json::Stream::emit_json_array_value(pSVar1,pbVar4[sVar6]);
    }
    simple_json::Stream::end_json_array(pSVar1);
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_array(const SPIRType &type)
{
	if (!is_physical_pointer(type) && !type.array.empty())
	{
		json_stream->emit_json_key_array("array");
		// Note that we emit the zeros here as a means of identifying
		// unbounded arrays.  This is necessary as otherwise there would
		// be no way of differentiating between float[4] and float[4][]
		for (const auto &value : type.array)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();

		json_stream->emit_json_key_array("array_size_is_literal");
		for (const auto &value : type.array_size_literal)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();
	}
}